

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O0

pair<llvm::StringMapIterator<bool>,_bool> __thiscall
llvm::StringMap<bool,_llvm::MallocAllocator>::try_emplace<bool>
          (StringMap<bool,_llvm::MallocAllocator> *this,StringRef Key,bool *Args)

{
  StringMapEntryBase *pSVar1;
  StringMapEntryBase *pSVar2;
  StringMapEntry<bool> *pSVar3;
  bool *in_R8;
  StringRef Key_00;
  pair<llvm::StringMapIterator<bool>,_bool> pVar4;
  bool local_91;
  StringMapIterator<bool> local_90;
  StringMap<bool,_llvm::MallocAllocator> *local_88;
  char *local_80;
  bool local_61;
  StringMapIterator<bool> local_60;
  StringMapEntryBase **local_58;
  StringMapEntryBase **Bucket;
  char *local_48;
  uint local_3c;
  MallocAllocator *pMStack_38;
  uint BucketNo;
  bool *Args_local;
  StringMap<bool,_llvm::MallocAllocator> *this_local;
  StringRef Key_local;
  undefined1 local_10;
  
  local_48 = (char *)Key.Length;
  Bucket = (StringMapEntryBase **)Key.Data;
  pMStack_38 = (MallocAllocator *)Args;
  Args_local = (bool *)this;
  this_local = (StringMap<bool,_llvm::MallocAllocator> *)Bucket;
  Key_local.Data = local_48;
  local_3c = StringMapImpl::LookupBucketFor(&this->super_StringMapImpl,Key);
  local_58 = (this->super_StringMapImpl).TheTable + local_3c;
  if (*local_58 != (StringMapEntryBase *)0x0) {
    pSVar1 = *local_58;
    pSVar2 = StringMapImpl::getTombstoneVal();
    if (pSVar1 != pSVar2) {
      StringMapIterator<bool>::StringMapIterator
                (&local_60,(this->super_StringMapImpl).TheTable + local_3c,false);
      local_61 = false;
      pVar4 = std::make_pair<llvm::StringMapIterator<bool>,bool>(&local_60,&local_61);
      local_10 = pVar4.second;
      goto LAB_001b8ab6;
    }
  }
  pSVar1 = *local_58;
  pSVar2 = StringMapImpl::getTombstoneVal();
  if (pSVar1 == pSVar2) {
    (this->super_StringMapImpl).NumTombstones = (this->super_StringMapImpl).NumTombstones - 1;
  }
  local_88 = this_local;
  local_80 = Key_local.Data;
  Key_00.Length = &this->field_0x18;
  Key_00.Data = Key_local.Data;
  pSVar3 = StringMapEntry<bool>::Create<llvm::MallocAllocator,bool>
                     ((StringMapEntry<bool> *)this_local,Key_00,pMStack_38,in_R8);
  *local_58 = &pSVar3->super_StringMapEntryBase;
  (this->super_StringMapImpl).NumItems = (this->super_StringMapImpl).NumItems + 1;
  if ((this->super_StringMapImpl).NumBuckets <
      (this->super_StringMapImpl).NumItems + (this->super_StringMapImpl).NumTombstones) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<bool>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = bool, AllocatorTy = llvm::MallocAllocator, ArgsTy = <bool>]"
                 );
  }
  local_3c = StringMapImpl::RehashTable(&this->super_StringMapImpl,local_3c);
  StringMapIterator<bool>::StringMapIterator
            (&local_90,(this->super_StringMapImpl).TheTable + local_3c,false);
  local_91 = true;
  pVar4 = std::make_pair<llvm::StringMapIterator<bool>,bool>(&local_90,&local_91);
  local_10 = pVar4.second;
LAB_001b8ab6:
  Key_local.Length =
       (size_t)pVar4.first.
               super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>.
               Ptr;
  pVar4.second = (bool)local_10;
  pVar4.first.super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>.
  Ptr = (StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>)
        (StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>)
        Key_local.Length;
  return pVar4;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }